

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::AddFacesFromNodeSet
          (ChContactSurfaceNodeCloud *this,
          vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
          *node_set,double point_radius)

{
  element_type *peVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar7;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_58;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_48;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
  *local_38;
  
  if (((this->super_ChContactSurface).m_mesh != (ChMesh *)0x0) &&
     (psVar6 = (node_set->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (node_set->
     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
     )._M_impl.super__Vector_impl_data._M_finish != psVar6)) {
    uVar5 = 0;
    uVar7 = 1;
    local_38 = node_set;
    do {
      peVar1 = psVar6[uVar5].
               super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        peVar3 = (element_type *)0x0;
      }
      else {
        peVar3 = (element_type *)
                 __dynamic_cast(peVar1,&ChNodeFEAbase::typeinfo,&ChNodeFEAxyz::typeinfo,0);
      }
      if (peVar3 == (element_type *)0x0) {
        peVar3 = (element_type *)0x0;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        this_01 = psVar6[uVar5].
                  super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
      }
      if (peVar3 == (element_type *)0x0) {
        psVar6 = (node_set->
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        peVar1 = psVar6[uVar5].
                 super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 == (element_type *)0x0) {
          peVar4 = (element_type *)0x0;
        }
        else {
          peVar4 = (element_type *)
                   __dynamic_cast(peVar1,&ChNodeFEAbase::typeinfo,&ChNodeFEAxyzrot::typeinfo,0);
        }
        node_set = local_38;
        if (peVar4 == (element_type *)0x0) {
          peVar4 = (element_type *)0x0;
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          this_00._M_pi =
               psVar6[uVar5].
               super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            }
          }
        }
        if (peVar4 != (element_type *)0x0) {
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            }
          }
          local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar4;
          local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = this_00._M_pi;
          AddNode(this,&local_58,point_radius);
          if (local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      else {
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar3;
        local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = this_01;
        AddNode(this,&local_48,point_radius);
        this_00._M_pi =
             local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      psVar6 = (node_set->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar7 < (ulong)((long)(node_set->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4)
      ;
      uVar5 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void ChContactSurfaceNodeCloud::AddFacesFromNodeSet(std::vector<std::shared_ptr<ChNodeFEAbase> >& node_set,
                                                    const double point_radius) {
    if (!m_mesh)
        return;
    for (unsigned int i = 0; i < node_set.size(); ++i)
        if (auto mnodeFEA = std::dynamic_pointer_cast<ChNodeFEAxyz>(node_set[i]))
            this->AddNode(mnodeFEA, point_radius);
        else if (auto mnodeFEArot = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(node_set[i]))
            this->AddNode(mnodeFEArot, point_radius);
}